

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O1

cmFileLockResult __thiscall cmFileLockPool::Release(cmFileLockPool *this,string *filename)

{
  ScopePool *pSVar1;
  bool bVar2;
  cmFileLockResult in_RAX;
  cmFileLockResult cVar3;
  List *__range1;
  ScopePool *pSVar4;
  bool bVar5;
  cmFileLockResult local_38;
  
  pSVar4 = (this->FunctionScopes).
           super__Vector_base<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->FunctionScopes).
           super__Vector_base<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = pSVar4 == pSVar1;
  local_38 = in_RAX;
  if (!bVar5) {
    local_38 = ScopePool::Release(pSVar4,filename);
    bVar2 = cmFileLockResult::IsOk(&local_38);
    if (bVar2) {
      do {
        pSVar4 = pSVar4 + 1;
        bVar5 = pSVar4 == pSVar1;
        if (bVar5) goto LAB_003c24a5;
        local_38 = ScopePool::Release(pSVar4,filename);
        bVar2 = cmFileLockResult::IsOk(&local_38);
      } while (bVar2);
    }
    if (!bVar5) {
      return local_38;
    }
  }
LAB_003c24a5:
  pSVar4 = (this->FileScopes).
           super__Vector_base<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->FileScopes).
           super__Vector_base<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = pSVar4 == pSVar1;
  if (!bVar5) {
    local_38 = ScopePool::Release(pSVar4,filename);
    bVar2 = cmFileLockResult::IsOk(&local_38);
    if (bVar2) {
      do {
        pSVar4 = pSVar4 + 1;
        bVar5 = pSVar4 == pSVar1;
        if (bVar5) goto LAB_003c2504;
        local_38 = ScopePool::Release(pSVar4,filename);
        bVar2 = cmFileLockResult::IsOk(&local_38);
      } while (bVar2);
    }
    if (!bVar5) {
      return local_38;
    }
  }
LAB_003c2504:
  cVar3 = ScopePool::Release(&this->ProcessScope,filename);
  return cVar3;
}

Assistant:

cmFileLockResult cmFileLockPool::Release(const std::string& filename)
{
  for (auto& funcScope : this->FunctionScopes) {
    const cmFileLockResult result = funcScope.Release(filename);
    if (!result.IsOk()) {
      return result;
    }
  }

  for (auto& fileScope : this->FileScopes) {
    const cmFileLockResult result = fileScope.Release(filename);
    if (!result.IsOk()) {
      return result;
    }
  }

  return this->ProcessScope.Release(filename);
}